

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

Boxed_Number __thiscall
chaiscript::boxed_cast<chaiscript::Boxed_Number_const>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Number BVar7;
  Type_Info local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_38.m_type_info = (type_info *)&Boxed_Number::typeinfo;
    local_38.m_bare_type_info = (type_info *)&Boxed_Number::typeinfo;
    local_38.m_flags = 1;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,&local_38);
    if (!bVar4) {
      bVar4 = Type_Conversions::convertable_type<chaiscript::Boxed_Number_const>
                        (*(Type_Conversions **)t_conversions);
      if (bVar4) {
        bVar4 = Type_Conversions::convertable_type<chaiscript::Boxed_Number_const>
                          (*(Type_Conversions **)t_conversions);
        if (!bVar4) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar1 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_38.m_flags = (peVar1->m_type_info).m_flags;
          local_38._20_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
          ptVar2 = (peVar1->m_type_info).m_type_info;
          ptVar3 = (peVar1->m_type_info).m_bare_type_info;
          *puVar5 = &PTR__bad_cast_001cba70;
          local_38.m_type_info._0_4_ = SUB84(ptVar2,0);
          local_38.m_type_info._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
          local_38.m_bare_type_info._0_4_ = SUB84(ptVar3,0);
          local_38.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          *(undefined4 *)(puVar5 + 1) = local_38.m_type_info._0_4_;
          *(undefined4 *)((long)puVar5 + 0xc) = local_38.m_type_info._4_4_;
          *(undefined4 *)(puVar5 + 2) = local_38.m_bare_type_info._0_4_;
          *(undefined4 *)((long)puVar5 + 0x14) = local_38.m_bare_type_info._4_4_;
          puVar5[3] = local_38._16_8_;
          puVar5[4] = &Boxed_Number::typeinfo;
          puVar5[5] = 0x19;
          puVar5[6] = "Cannot perform boxed_cast";
          local_38.m_type_info = ptVar2;
          local_38.m_bare_type_info = ptVar3;
          __cxa_throw(puVar5,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        Type_Conversions::boxed_type_conversion<chaiscript::Boxed_Number_const>
                  ((Type_Conversions *)&local_38,*(Conversion_Saves **)t_conversions,
                   *(Boxed_Value **)(t_conversions + 8));
        detail::Cast_Helper<chaiscript::Boxed_Number>::cast
                  ((Boxed_Value *)this,(Type_Conversions_State *)&local_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.m_bare_type_info);
        _Var6._M_pi = extraout_RDX;
        goto LAB_00164184;
      }
    }
  }
  BVar7 = detail::Cast_Helper<chaiscript::Boxed_Number>::cast
                    ((Boxed_Value *)this,(Type_Conversions_State *)bv);
  _Var6._M_pi = BVar7.bv.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_00164184:
  BVar7.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar7.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar7.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }